

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

void __thiscall icu_63::FCDUTF8CollationIterator::switchToBackward(FCDUTF8CollationIterator *this)

{
  int32_t iVar1;
  FCDUTF8CollationIterator *this_local;
  
  if (this->state == CHECK_FWD) {
    this->limit = (this->super_UTF8CollationIterator).pos;
    if ((this->super_UTF8CollationIterator).pos == this->start) {
      this->state = CHECK_BWD;
    }
    else {
      this->state = IN_FCD_SEGMENT;
    }
  }
  else {
    if (this->state != IN_FCD_SEGMENT) {
      iVar1 = this->start;
      (this->super_UTF8CollationIterator).pos = iVar1;
      this->limit = iVar1;
    }
    this->state = CHECK_BWD;
  }
  return;
}

Assistant:

void
FCDUTF8CollationIterator::switchToBackward() {
    U_ASSERT(state == CHECK_FWD ||
             (state == IN_FCD_SEGMENT && pos == start) ||
             (state >= IN_NORMALIZED && pos == 0));
    if(state == CHECK_FWD) {
        // Turn around from forward checking.
        limit = pos;
        if(pos == start) {
            state = CHECK_BWD;  // Check backward.
        } else {  // pos > start
            state = IN_FCD_SEGMENT;  // Stay in FCD segment.
        }
    } else {
        // Reached the start of the FCD segment.
        if(state == IN_FCD_SEGMENT) {
            // The input text segment is FCD, extend it backward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking backward from it.
            limit = pos = start;
        }
        state = CHECK_BWD;
    }
}